

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void av1_inv_txfm2d_add_4x4_sse4_1
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 in_CL;
  int32_t *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  uint16_t *in_stack_00000010;
  int8_t *shift;
  __m128i in [4];
  int in_stack_000000a8;
  int in_stack_000000ac;
  int in_stack_000000b0;
  int in_stack_000000b4;
  __m128i *in_stack_000000b8;
  __m128i *in_stack_000000c0;
  int in_stack_000001c0;
  int in_stack_000001c4;
  int in_stack_000001c8;
  int in_stack_000001cc;
  __m128i *in_stack_000001d0;
  __m128i *in_stack_000001d8;
  int in_stack_00000380;
  longlong local_68 [13];
  
  switch(in_CL) {
  case 0:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    idct4x4_sse4_1(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,
                   in_stack_000000ac,in_stack_000000a8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    idct4x4_sse4_1(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,
                   in_stack_000000ac,in_stack_000000a8);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 1:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    idct4x4_sse4_1(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,
                   in_stack_000000ac,in_stack_000000a8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 2:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    idct4x4_sse4_1(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,
                   in_stack_000000ac,in_stack_000000a8);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 3:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 4:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    idct4x4_sse4_1(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,
                   in_stack_000000ac,in_stack_000000a8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 5:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    idct4x4_sse4_1(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,
                   in_stack_000000ac,in_stack_000000a8);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 6:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 7:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 8:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 9:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iidentity4_sse4_1((__m128i *)in[1][1],(__m128i *)in[1][0],in[0][1]._4_4_,(int)in[0][1],
                      in[0][0]._4_4_,(int)in[0][0]);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iidentity4_sse4_1((__m128i *)in[1][1],(__m128i *)in[1][0],in[0][1]._4_4_,(int)in[0][1],
                      in[0][0]._4_4_,(int)in[0][0]);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 10:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iidentity4_sse4_1((__m128i *)in[1][1],(__m128i *)in[1][0],in[0][1]._4_4_,(int)in[0][1],
                      in[0][0]._4_4_,(int)in[0][0]);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    idct4x4_sse4_1(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,
                   in_stack_000000ac,in_stack_000000a8);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 0xb:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    idct4x4_sse4_1(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,
                   in_stack_000000ac,in_stack_000000a8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iidentity4_sse4_1((__m128i *)in[1][1],(__m128i *)in[1][0],in[0][1]._4_4_,(int)in[0][1],
                      in[0][0]._4_4_,(int)in[0][0]);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 0xc:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iidentity4_sse4_1((__m128i *)in[1][1],(__m128i *)in[1][0],in[0][1]._4_4_,(int)in[0][1],
                      in[0][0]._4_4_,(int)in[0][0]);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 0xd:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iidentity4_sse4_1((__m128i *)in[1][1],(__m128i *)in[1][0],in[0][1]._4_4_,(int)in[0][1],
                      in[0][0]._4_4_,(int)in[0][0]);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 0xe:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iidentity4_sse4_1((__m128i *)in[1][1],(__m128i *)in[1][0],in[0][1]._4_4_,(int)in[0][1],
                      in[0][0]._4_4_,(int)in[0][0]);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
    break;
  case 0xf:
    load_buffer_4x4(in_RDI,(__m128i *)local_68);
    iadst4x4_sse4_1(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c8,
                    in_stack_000001c4,in_stack_000001c0);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    iidentity4_sse4_1((__m128i *)in[1][1],(__m128i *)in[1][0],in[0][1]._4_4_,(int)in[0][1],
                      in[0][0]._4_4_,(int)in[0][0]);
    write_buffer_4x4((__m128i *)shift,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                     unaff_retaddr_00,unaff_retaddr,in_stack_00000380);
  }
  return;
}

Assistant:

void av1_inv_txfm2d_add_4x4_sse4_1(const int32_t *input, uint16_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  __m128i in[4];
  const int8_t *shift = av1_inv_txfm_shift_ls[TX_4X4];

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case DCT_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case FLIPADST_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 1, -shift[1], bd);
      break;
    case DCT_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 0, -shift[1], bd);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 1, -shift[1], bd);
      break;
    case ADST_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 0, -shift[1], bd);
      break;
    case FLIPADST_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 1, -shift[1], bd);
      break;
    case IDTX:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case V_DCT:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case H_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case V_ADST:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case H_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case V_FLIPADST:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 1, -shift[1], bd);
      break;
    case H_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 0, -shift[1], bd);
      break;
    default: assert(0);
  }
}